

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::parse_date(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type previous;
  size_type previous_00;
  Datetime *pDVar4;
  int year;
  int weekday;
  int month;
  int day;
  int week;
  int julian;
  
  pDVar4 = (Datetime *)pig;
  previous = Pig::cursor(pig);
  year = 0;
  month = 0;
  julian = 0;
  week = 0;
  weekday = 0;
  day = 0;
  bVar1 = parse_year(pDVar4,pig,&year);
  if (bVar1) {
    previous_00 = Pig::cursor(pig);
    pDVar4 = (Datetime *)pig;
    bVar1 = Pig::skip(pig,0x57);
    if ((bVar1) && (bVar1 = parse_week(pDVar4,pig,&week), bVar1)) {
      bVar1 = parse_weekday(pDVar4,pig,&weekday);
      if (!bVar1) {
        weekday = weekstart;
      }
      uVar3 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = year;
        this->_week = week;
        this->_weekday = weekday;
        return true;
      }
    }
    pDVar4 = (Datetime *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_julian(pDVar4,pig,&julian);
    if (bVar1) {
      uVar3 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = year;
        this->_julian = julian;
        return true;
      }
    }
    pDVar4 = (Datetime *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_month(pDVar4,pig,&month);
    if (bVar1) {
      bVar1 = parse_day(pDVar4,pig,&day);
      uVar3 = Pig::peek(pig);
      bVar2 = unicodeLatinDigit(uVar3);
      if (bVar1) {
        if (!bVar2) {
          this->_year = year;
          this->_month = month;
          this->_day = day;
          return true;
        }
      }
      else if (!bVar2) {
        this->_year = year;
        this->_month = month;
        this->_day = 1;
        return true;
      }
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_date (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int year {};
  int month {};
  int julian {};
  int week {};
  int weekday {};
  int day {};
  if (parse_year (pig, year))
  {
    auto checkpointYear = pig.cursor ();

    if (pig.skip ('W') &&
        parse_week (pig, week))
    {
      if (! (parse_weekday (pig, weekday)))
        weekday = Datetime::weekstart;

      if (! unicodeLatinDigit (pig.peek ()))
      {
        _year = year;
        _week = week;
        _weekday = weekday;
        return true;
      }
    }

    pig.restoreTo (checkpointYear);

    if (parse_julian (pig, julian) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _julian = julian;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month))
    {
      if (parse_day (pig, day))
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = day;
          return true;
        }
      }
      else
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = 1;
          return true;
        }
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}